

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdAllItemsEntityType_Test::TestBody
          (Annotator_automaticIdAllItemsEntityType_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_1090 [8];
  Message local_1088 [8];
  shared_ptr<libcellml::Variable> local_1080;
  shared_ptr<libcellml::Variable> local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  undefined1 local_1040 [8];
  AssertionResult gtest_ar_29;
  Message local_1028 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar_28;
  Message local_fe8 [8];
  shared_ptr<libcellml::Variable> local_fe0;
  shared_ptr<libcellml::Variable> local_fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar_27;
  Message local_f88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  undefined1 local_f60 [8];
  AssertionResult gtest_ar_26;
  string local_f48 [39];
  allocator<char> local_f21;
  string local_f20 [32];
  shared_ptr<libcellml::Component> local_f00;
  shared_ptr<libcellml::Variable> local_ef0;
  allocator<char> local_ed9;
  string local_ed8 [39];
  allocator<char> local_eb1;
  string local_eb0 [32];
  shared_ptr<libcellml::Component> local_e90;
  shared_ptr<libcellml::Variable> local_e80;
  shared_ptr local_e70 [16];
  undefined1 local_e60 [8];
  VariablePairPtr mapping2;
  string local_e48 [39];
  allocator<char> local_e21;
  string local_e20 [32];
  shared_ptr<libcellml::Component> local_e00;
  shared_ptr<libcellml::Variable> local_df0;
  allocator<char> local_dd9;
  string local_dd8 [39];
  allocator<char> local_db1;
  string local_db0 [32];
  shared_ptr<libcellml::Component> local_d90;
  shared_ptr<libcellml::Variable> local_d80;
  shared_ptr local_d70 [16];
  undefined1 local_d60 [8];
  VariablePairPtr connection2;
  string local_d48 [32];
  shared_ptr<libcellml::Variable> local_d28;
  shared_ptr<libcellml::Variable> local_d18;
  allocator<char> local_d01;
  string local_d00 [32];
  shared_ptr<libcellml::Variable> local_ce0;
  shared_ptr<libcellml::Variable> local_cd0;
  AssertHelper local_cc0 [8];
  Message local_cb8 [15];
  allocator<char> local_ca9;
  string local_ca8 [32];
  shared_ptr<libcellml::Component> local_c88;
  shared_ptr<libcellml::Variable> local_c78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar_25;
  Message local_c30 [15];
  allocator<char> local_c21;
  string local_c20 [32];
  shared_ptr<libcellml::Component> local_c00;
  shared_ptr<libcellml::Variable> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_24;
  Message local_ba8 [8];
  shared_ptr<libcellml::Units> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar_23;
  Message local_b58 [8];
  shared_ptr<libcellml::Units> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_22;
  Message local_b08 [8];
  shared_ptr<libcellml::Units> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_21;
  Message local_ab8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_20;
  Message local_a78 [15];
  allocator<char> local_a69;
  string local_a68 [32];
  shared_ptr<libcellml::Component> local_a48;
  shared_ptr<libcellml::Reset> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_19;
  Message local_9f0 [15];
  allocator<char> local_9e1;
  string local_9e0 [32];
  shared_ptr<libcellml::Component> local_9c0;
  shared_ptr<libcellml::Reset> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_18;
  Message local_968 [15];
  allocator<char> local_959;
  string local_958 [32];
  shared_ptr<libcellml::Component> local_938;
  shared_ptr<libcellml::Reset> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar_17;
  Message local_8e0 [15];
  allocator<char> local_8d1;
  string local_8d0 [32];
  shared_ptr<libcellml::Component> local_8b0;
  shared_ptr<libcellml::Reset> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_16;
  Message local_858 [15];
  allocator<char> local_849;
  string local_848 [32];
  shared_ptr<libcellml::Component> local_828;
  shared_ptr<libcellml::Reset> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_15;
  Message local_7d0 [15];
  allocator<char> local_7c1;
  string local_7c0 [32];
  shared_ptr<libcellml::Component> local_7a0;
  shared_ptr<libcellml::Reset> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_14;
  Message local_748 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_13;
  Message local_708 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_12;
  Message local_6c8 [8];
  shared_ptr<libcellml::Variable> local_6c0;
  shared_ptr<libcellml::Variable> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_11;
  Message local_668 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_10;
  Message local_628 [15];
  allocator<char> local_619;
  string local_618 [32];
  shared_ptr<libcellml::Component> local_5f8;
  shared_ptr<libcellml::ImportSource> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_9;
  Message local_5a0 [15];
  allocator<char> local_591;
  string local_590 [32];
  shared_ptr<libcellml::Component> local_570;
  shared_ptr<libcellml::ImportSource> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_8;
  Message local_518 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_7;
  Message local_4d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_6;
  Message local_498 [8];
  shared_ptr<libcellml::Variable> local_490;
  shared_ptr<libcellml::Variable> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_5;
  Message local_438 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_4;
  Message local_3f8 [15];
  allocator<char> local_3e9;
  string local_3e8 [32];
  shared_ptr<libcellml::Component> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_3;
  Message local_380 [15];
  allocator<char> local_371;
  string local_370 [32];
  shared_ptr<libcellml::Component> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_2;
  Message local_308 [8];
  shared_ptr<libcellml::Component> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_1;
  Message local_2b8 [8];
  shared_ptr<libcellml::Component> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  AssertionResult gtest_ar;
  undefined1 local_260 [8];
  UnitsItemPtr unitsItem;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [32];
  shared_ptr<libcellml::Component> local_200;
  shared_ptr<libcellml::Variable> local_1f0;
  shared_ptr<libcellml::Variable> local_1e0;
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [32];
  shared_ptr<libcellml::Component> local_180;
  string local_170 [16];
  undefined1 local_160 [8];
  VariablePairPtr mapping;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  shared_ptr<libcellml::Component> local_100;
  shared_ptr<libcellml::Variable> local_f0;
  shared_ptr<libcellml::Variable> local_e0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  shared_ptr<libcellml::Component> local_80;
  string local_70 [16];
  undefined1 local_60 [8];
  VariablePairPtr connection;
  AnnotatorPtr annotator;
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Annotator_automaticIdAllItemsEntityType_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_30);
  libcellml::Annotator::create();
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"component2",&local_a1);
  libcellml::ComponentEntity::component((string *)&local_80,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"variable1",&local_c9);
  libcellml::Component::variable(local_70);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"component2",&local_121);
  libcellml::ComponentEntity::component((string *)&local_100,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"variable1",
             (allocator<char> *)
             ((long)&mapping.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)&local_f0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f0);
  libcellml::Variable::equivalentVariable((ulong)&local_e0);
  libcellml::VariablePair::create((shared_ptr *)local_60,(shared_ptr *)local_70);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_e0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_f0);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mapping.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_70);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"component2",&local_1a1);
  libcellml::ComponentEntity::component((string *)&local_180,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"variable2",&local_1c9);
  libcellml::Component::variable(local_170);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"component2",&local_221);
  libcellml::ComponentEntity::component((string *)&local_200,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,"variable2",
             (allocator<char> *)
             ((long)&unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)&local_1f0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1f0);
  libcellml::Variable::equivalentVariable((ulong)&local_1e0);
  libcellml::VariablePair::create((shared_ptr *)local_160,(shared_ptr *)local_170);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1e0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1f0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_200);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_170);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&gtest_ar.message_);
  libcellml::UnitsItem::create((shared_ptr *)local_260,(ulong)&gtest_ar.message_);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&gtest_ar.message_)
  ;
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_2b0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_2a0,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_280,"\"b4da55\"","annotator->assignId(model->component(0))",
             (char (*) [7])"b4da55",&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(local_2b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x60e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_300);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_300);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_2d0,"\"b4da55\"","model->component(0)->id()",
             (char (*) [7])"b4da55",&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(local_308);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x60f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"component2",&local_371);
  libcellml::ComponentEntity::component((string *)&local_350,SUB81(peVar2,0));
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_340,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_320,"\"b4da56\"",
             "annotator->assignId(model->component(\"component2\"), libcellml::CellmlElementType::COMPONENT_REF)"
             ,(char (*) [7])"b4da56",&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_350);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(local_380);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x611,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"component2",&local_3e9);
  libcellml::ComponentEntity::component((string *)&local_3c8,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3c8);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_398,"\"b4da56\"",
             "model->component(\"component2\")->encapsulationId()",(char (*) [7])"b4da56",&local_3b8
            );
  std::__cxx11::string::~string((string *)&local_3b8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3c8);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(local_3f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x612,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_430,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_410,"\"b4da57\"",
             "annotator->assignId(connection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da57",&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(local_438);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x614,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_60);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_60);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_470,(shared_ptr *)&local_480);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_450,"\"b4da57\"",
             "libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2())"
             ,(char (*) [7])"b4da57",&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_490);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(local_498);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x615,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_4d0,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_4b0,"\"b4da58\"",
             "annotator->assignId(model, libcellml::CellmlElementType::ENCAPSULATION)",
             (char (*) [7])"b4da58",&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(local_4d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x617,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_4f0,"\"b4da58\"","model->encapsulationId()",
             (char (*) [7])"b4da58",&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(local_518);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x618,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_590,"component1",&local_591);
  libcellml::ComponentEntity::component((string *)&local_570,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_570);
  libcellml::ImportedEntity::importSource();
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_550);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_530,"\"b4da59\"",
             "annotator->assignId(model->component(\"component1\")->importSource())",
             (char (*) [7])"b4da59",&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_560);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_570);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(local_5a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x61a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_618,"component1",&local_619);
  libcellml::ComponentEntity::component((string *)&local_5f8,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_5f8);
  libcellml::ImportedEntity::importSource();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_5e8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_5b8,"\"b4da59\"",
             "model->component(\"component1\")->importSource()->id()",(char (*) [7])"b4da59",
             &local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_5e8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_5f8);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(local_628);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x61b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_660,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_640,"\"b4da5a\"","annotator->assignId(mapping)",
             (char (*) [7])"b4da5a",&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(local_668);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x61d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_160);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_160);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_6a0,(shared_ptr *)&local_6b0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_680,"\"b4da5a\"",
             "libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2())"
             ,(char (*) [7])"b4da5a",&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_6c0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(local_6c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x61e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_700,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_6e0,"\"b4da5b\"","annotator->assignId(model)",
             (char (*) [7])"b4da5b",&local_700);
  std::__cxx11::string::~string((string *)&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(local_708);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x620,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_720,"\"b4da5b\"","model->id()",(char (*) [7])"b4da5b",
             &local_740);
  std::__cxx11::string::~string((string *)&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(local_748);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x621,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"component2",&local_7c1);
  libcellml::ComponentEntity::component((string *)&local_7a0,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_7a0);
  libcellml::Component::reset((ulong)&local_790);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_780,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_760,"\"b4da5c\"",
             "annotator->assignId(model->component(\"component2\")->reset(0))",
             (char (*) [7])"b4da5c",&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_790);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_7a0);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(local_7d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x623,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_848,"component2",&local_849);
  libcellml::ComponentEntity::component((string *)&local_828,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_828);
  libcellml::Component::reset((ulong)&local_818);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_818);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_7e8,"\"b4da5c\"",
             "model->component(\"component2\")->reset(0)->id()",(char (*) [7])"b4da5c",&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_818);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_828);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(local_858);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x624,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_858);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8d0,"component2",&local_8d1);
  libcellml::ComponentEntity::component((string *)&local_8b0,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_8b0);
  libcellml::Component::reset((ulong)&local_8a0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_890,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_870,"\"b4da5d\"",
             "annotator->assignId(model->component(\"component2\")->reset(0), libcellml::CellmlElementType::RESET_VALUE)"
             ,(char (*) [7])"b4da5d",&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_8a0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_8b0);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar1) {
    testing::Message::Message(local_8e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x626,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_8e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_958,"component2",&local_959);
  libcellml::ComponentEntity::component((string *)&local_938,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_938);
  libcellml::Component::reset((ulong)&local_928);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_928);
  libcellml::Reset::resetValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_8f8,"\"b4da5d\"",
             "model->component(\"component2\")->reset(0)->resetValueId()",(char (*) [7])"b4da5d",
             &local_918);
  std::__cxx11::string::~string((string *)&local_918);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_928);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_938);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar1) {
    testing::Message::Message(local_968);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x627,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9e0,"component2",&local_9e1);
  libcellml::ComponentEntity::component((string *)&local_9c0,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_9c0);
  libcellml::Component::reset((ulong)&local_9b0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_9a0,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_980,"\"b4da5e\"",
             "annotator->assignId(model->component(\"component2\")->reset(0), libcellml::CellmlElementType::TEST_VALUE)"
             ,(char (*) [7])"b4da5e",&local_9a0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_9b0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_9c0);
  std::__cxx11::string::~string(local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(local_9f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x629,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a68,"component2",&local_a69);
  libcellml::ComponentEntity::component((string *)&local_a48,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_a48);
  libcellml::Component::reset((ulong)&local_a38);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_a38);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a08,"\"b4da5e\"",
             "model->component(\"component2\")->reset(0)->testValueId()",(char (*) [7])"b4da5e",
             &local_a28);
  std::__cxx11::string::~string((string *)&local_a28);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_a38);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_a48);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator(&local_a69);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(local_a78);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x62a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_a78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_ab0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a90,"\"b4da5f\"","annotator->assignId(unitsItem)",
             (char (*) [7])"b4da5f",&local_ab0);
  std::__cxx11::string::~string((string *)&local_ab0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
  if (!bVar1) {
    testing::Message::Message(local_ab8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x62c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_ab8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_b00);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_b00);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_af0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_ad0,"\"b4da5f\"","model->units(1)->unitId(0)",
             (char (*) [7])"b4da5f",&local_af0);
  std::__cxx11::string::~string((string *)&local_af0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_b00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar1) {
    testing::Message::Message(local_b08);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ad0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x62d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_b08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_b50);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_b40);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_b20,"\"b4da60\"","annotator->assignId(model->units(1))",
             (char (*) [7])"b4da60",&local_b40);
  std::__cxx11::string::~string((string *)&local_b40);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_b50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
  if (!bVar1) {
    testing::Message::Message(local_b58);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x62f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_b58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_b58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_ba0);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ba0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_b70,"\"b4da60\"","model->units(1)->id()",
             (char (*) [7])"b4da60",&local_b90);
  std::__cxx11::string::~string((string *)&local_b90);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
  if (!bVar1) {
    testing::Message::Message(local_ba8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x630,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c20,"component2",&local_c21);
  libcellml::ComponentEntity::component((string *)&local_c00,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c00);
  libcellml::Component::variable((ulong)&local_bf0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_be0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_bc0,"\"b4da61\"",
             "annotator->assignId(model->component(\"component2\")->variable(0))",
             (char (*) [7])"b4da61",&local_be0);
  std::__cxx11::string::~string((string *)&local_be0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_bf0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c00);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator(&local_c21);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(local_c30);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x632,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_c30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ca8,"component2",&local_ca9);
  libcellml::ComponentEntity::component((string *)&local_c88,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c88);
  libcellml::Component::variable((ulong)&local_c78);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c78);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_c48,"\"b4da61\"",
             "model->component(\"component2\")->variable(0)->id()",(char (*) [7])"b4da61",&local_c68
            );
  std::__cxx11::string::~string((string *)&local_c68);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_c78);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c88);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator(&local_ca9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(local_cb8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c48);
    testing::internal::AssertHelper::AssertHelper
              (local_cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x633,pcVar4);
    testing::internal::AssertHelper::operator=(local_cc0,local_cb8);
    testing::internal::AssertHelper::~AssertHelper(local_cc0);
    testing::Message::~Message(local_cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_60);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_60);
  libcellml::VariablePair::variable2();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d00,"",&local_d01);
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)&local_cd0,(shared_ptr *)&local_ce0,local_d00);
  std::__cxx11::string::~string(local_d00);
  std::allocator<char>::~allocator(&local_d01);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_ce0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_cd0);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_160);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_160);
  libcellml::VariablePair::variable2();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d48,"",
             (allocator<char> *)
             ((long)&connection2.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setEquivalenceMappingId
            ((shared_ptr *)&local_d18,(shared_ptr *)&local_d28,local_d48);
  std::__cxx11::string::~string(local_d48);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&connection2.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_d28);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_d18);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_db0,"component2",&local_db1);
  libcellml::ComponentEntity::component((string *)&local_d90,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_dd8,"variable1",&local_dd9);
  libcellml::Component::variable((string *)&local_d80);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d80);
  libcellml::Variable::equivalentVariable((ulong)local_d70);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e20,"component2",&local_e21);
  libcellml::ComponentEntity::component((string *)&local_e00,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e48,"variable1",
             (allocator<char> *)
             ((long)&mapping2.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)&local_df0);
  libcellml::VariablePair::create((shared_ptr *)local_d60,local_d70);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_df0);
  std::__cxx11::string::~string(local_e48);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mapping2.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e00);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator(&local_e21);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d70);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_d80);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator(&local_dd9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_d90);
  std::__cxx11::string::~string(local_db0);
  std::allocator<char>::~allocator(&local_db1);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_eb0,"component2",&local_eb1);
  libcellml::ComponentEntity::component((string *)&local_e90,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ed8,"variable2",&local_ed9);
  libcellml::Component::variable((string *)&local_e80);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e80);
  libcellml::Variable::equivalentVariable((ulong)local_e70);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f20,"component2",&local_f21);
  libcellml::ComponentEntity::component((string *)&local_f00,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f48,"variable2",(allocator<char> *)((long)&gtest_ar_26.message_.ptr_ + 7));
  libcellml::Component::variable((string *)&local_ef0);
  libcellml::VariablePair::create((shared_ptr *)local_e60,local_e70);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_ef0);
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_26.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_f00);
  std::__cxx11::string::~string(local_f20);
  std::allocator<char>::~allocator(&local_f21);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_e70);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_e80);
  std::__cxx11::string::~string(local_ed8);
  std::allocator<char>::~allocator(&local_ed9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e90);
  std::__cxx11::string::~string(local_eb0);
  std::allocator<char>::~allocator(&local_eb1);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_f80,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_f60,"\"b4da62\"",
             "annotator->assignId(connection2, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da62",&local_f80);
  std::__cxx11::string::~string((string *)&local_f80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f60);
  if (!bVar1) {
    testing::Message::Message(local_f88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x640,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,local_f88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(local_f88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f60);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_d60);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_d60);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_fc0,(shared_ptr *)&local_fd0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_fa0,"\"b4da62\"",
             "libcellml::Variable::equivalenceConnectionId(connection2->variable1(), connection2->variable2())"
             ,(char (*) [7])"b4da62",&local_fc0);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_fe0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_fd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
  if (!bVar1) {
    testing::Message::Message(local_fe8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_fa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x641,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,local_fe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(local_fe8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_1020,(CellmlElementType)peVar3);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1000,"\"b4da63\"","annotator->assignId(mapping2)",
             (char (*) [7])"b4da63",&local_1020);
  std::__cxx11::string::~string((string *)&local_1020);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1000);
  if (!bVar1) {
    testing::Message::Message(local_1028);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1000);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x643,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(local_1028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1000);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_e60);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_e60);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_1060,(shared_ptr *)&local_1070);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1040,"\"b4da63\"",
             "libcellml::Variable::equivalenceMappingId(mapping2->variable1(), mapping2->variable2())"
             ,(char (*) [7])"b4da63",&local_1060);
  std::__cxx11::string::~string((string *)&local_1060);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1080);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1070);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1040);
  if (!bVar1) {
    testing::Message::Message(local_1088);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1040);
    testing::internal::AssertHelper::AssertHelper
              (local_1090,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x644,pcVar4);
    testing::internal::AssertHelper::operator=(local_1090,local_1088);
    testing::internal::AssertHelper::~AssertHelper(local_1090);
    testing::Message::~Message(local_1088);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1040);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_e60);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_d60);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr((shared_ptr<libcellml::UnitsItem> *)local_260);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_160);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_60);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, automaticIdAllItemsEntityType)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);
    auto annotator = libcellml::Annotator::create();

    auto connection = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1"),
        model->component("component2")->variable("variable1")->equivalentVariable(0));
    auto mapping = libcellml::VariablePair::create(
        model->component("component2")->variable("variable2"),
        model->component("component2")->variable("variable2")->equivalentVariable(0));
    auto unitsItem = libcellml::UnitsItem::create(model->units(1), 0);

    annotator->setModel(model);

    // Expect each to change since there were no identifiers in the first place.
    EXPECT_EQ("b4da55", annotator->assignId(model->component(0)));
    EXPECT_EQ("b4da55", model->component(0)->id());

    EXPECT_EQ("b4da56", annotator->assignId(model->component("component2"), libcellml::CellmlElementType::COMPONENT_REF));
    EXPECT_EQ("b4da56", model->component("component2")->encapsulationId());

    EXPECT_EQ("b4da57", annotator->assignId(connection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da57", libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2()));

    EXPECT_EQ("b4da58", annotator->assignId(model, libcellml::CellmlElementType::ENCAPSULATION));
    EXPECT_EQ("b4da58", model->encapsulationId());

    EXPECT_EQ("b4da59", annotator->assignId(model->component("component1")->importSource()));
    EXPECT_EQ("b4da59", model->component("component1")->importSource()->id());

    EXPECT_EQ("b4da5a", annotator->assignId(mapping));
    EXPECT_EQ("b4da5a", libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2()));

    EXPECT_EQ("b4da5b", annotator->assignId(model));
    EXPECT_EQ("b4da5b", model->id());

    EXPECT_EQ("b4da5c", annotator->assignId(model->component("component2")->reset(0)));
    EXPECT_EQ("b4da5c", model->component("component2")->reset(0)->id());

    EXPECT_EQ("b4da5d", annotator->assignId(model->component("component2")->reset(0), libcellml::CellmlElementType::RESET_VALUE));
    EXPECT_EQ("b4da5d", model->component("component2")->reset(0)->resetValueId());

    EXPECT_EQ("b4da5e", annotator->assignId(model->component("component2")->reset(0), libcellml::CellmlElementType::TEST_VALUE));
    EXPECT_EQ("b4da5e", model->component("component2")->reset(0)->testValueId());

    EXPECT_EQ("b4da5f", annotator->assignId(unitsItem));
    EXPECT_EQ("b4da5f", model->units(1)->unitId(0));

    EXPECT_EQ("b4da60", annotator->assignId(model->units(1)));
    EXPECT_EQ("b4da60", model->units(1)->id());

    EXPECT_EQ("b4da61", annotator->assignId(model->component("component2")->variable(0)));
    EXPECT_EQ("b4da61", model->component("component2")->variable(0)->id());

    // For coverage doing the other pair combo too.
    libcellml::Variable::setEquivalenceConnectionId(connection->variable1(), connection->variable2(), "");
    libcellml::Variable::setEquivalenceMappingId(mapping->variable1(), mapping->variable2(), "");

    auto connection2 = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1")->equivalentVariable(0),
        model->component("component2")->variable("variable1"));
    auto mapping2 = libcellml::VariablePair::create(
        model->component("component2")->variable("variable2")->equivalentVariable(0),
        model->component("component2")->variable("variable2"));

    EXPECT_EQ("b4da62", annotator->assignId(connection2, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da62", libcellml::Variable::equivalenceConnectionId(connection2->variable1(), connection2->variable2()));

    EXPECT_EQ("b4da63", annotator->assignId(mapping2));
    EXPECT_EQ("b4da63", libcellml::Variable::equivalenceMappingId(mapping2->variable1(), mapping2->variable2()));
}